

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hxx
# Opt level: O2

Solution * lineage::loadSolution(Solution *__return_storage_ptr__,string *fileName)

{
  istream *piVar1;
  uchar local_231;
  size_t edgeLabel;
  ifstream file;
  
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->edge_labels).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&file,(string *)fileName,_S_in);
  edgeLabel = 0;
  while( true ) {
    piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)&file);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    local_231 = (uchar)edgeLabel;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&__return_storage_ptr__->edge_labels,&local_231);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

inline
Solution loadSolution(std::string const& fileName)
{
    Solution solution;

    std::ifstream file(fileName);
    
    size_t edgeLabel = 0;
    while (file >> edgeLabel)
        solution.edge_labels.push_back(edgeLabel);
    
    file.close();

    return solution;
}